

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O1

int __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::SignalLink::unlink(SignalLink *this,char *__name)

{
  _Manager_type p_Var1;
  SignalLink *pSVar2;
  int extraout_EAX;
  
  p_Var1 = (this->function).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->function,(_Any_data *)&this->function,__destroy_functor);
    (this->function).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->function)._M_invoker = (_Invoker_type)0x0;
  }
  pSVar2 = this->next;
  if (pSVar2 != (SignalLink *)0x0) {
    pSVar2->prev = this->prev;
  }
  if (this->prev != (SignalLink *)0x0) {
    this->prev->next = pSVar2;
  }
  decref(this);
  return extraout_EAX;
}

Assistant:

void
    unlink ()
    {
      function = nullptr;
      if (next)
        next->prev = prev;
      if (prev)
        prev->next = next;
      decref();
      // leave intact ->next, ->prev for stale iterators
    }